

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O3

bool google::protobuf::compiler::cpp::HasLazyFields
               (FileDescriptor *file,Options *options,MessageSCCAnalyzer *scc_analyzer)

{
  bool bVar1;
  MessageSCCAnalyzer *extraout_RDX;
  MessageSCCAnalyzer *scc_analyzer_00;
  MessageSCCAnalyzer *extraout_RDX_00;
  long lVar2;
  long lVar3;
  
  scc_analyzer_00 = scc_analyzer;
  if (0 < *(int *)(file + 0x2c)) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      bVar1 = HasLazyFields((Descriptor *)(*(long *)(file + 0x58) + lVar2),options,scc_analyzer);
      if (bVar1) {
        return true;
      }
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x88;
      scc_analyzer_00 = extraout_RDX;
    } while (lVar3 < *(int *)(file + 0x2c));
  }
  if (*(int *)(file + 0x3c) < 1) {
    bVar1 = false;
  }
  else {
    lVar3 = 0;
    lVar2 = 0;
    do {
      bVar1 = IsLazy((FieldDescriptor *)(*(long *)(file + 0x70) + lVar3),options,scc_analyzer_00);
      if (bVar1) {
        return bVar1;
      }
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 0x48;
      scc_analyzer_00 = extraout_RDX_00;
    } while (lVar2 < *(int *)(file + 0x3c));
  }
  return bVar1;
}

Assistant:

bool HasLazyFields(const FileDescriptor* file, const Options& options,
                   MessageSCCAnalyzer* scc_analyzer) {
  for (int i = 0; i < file->message_type_count(); i++) {
    const Descriptor* descriptor(file->message_type(i));
    if (HasLazyFields(descriptor, options, scc_analyzer)) {
      return true;
    }
  }
  for (int field_idx = 0; field_idx < file->extension_count(); field_idx++) {
    if (IsLazy(file->extension(field_idx), options, scc_analyzer)) {
      return true;
    }
  }
  return false;
}